

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O3

size_t __thiscall
xmrig::Threads<xmrig::OclThreads>::move
          (Threads<xmrig::OclThreads> *this,char *profile,OclThreads *threads)

{
  pointer pOVar1;
  pointer pOVar2;
  const_iterator cVar3;
  size_t sVar4;
  pair<const_xmrig::String,_xmrig::OclThreads> local_50;
  
  String::String(&local_50.first,"cn/blur");
  cVar3 = std::
          _Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
          ::find((_Rb_tree<xmrig::String,_std::pair<const_xmrig::String,_xmrig::OclThreads>,_std::_Select1st<std::pair<const_xmrig::String,_xmrig::OclThreads>_>,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::OclThreads>_>_>
                  *)this,&local_50.first);
  if (local_50.first.m_data != (char *)0x0) {
    operator_delete__(local_50.first.m_data);
  }
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_profiles)._M_t._M_impl.super__Rb_tree_header) {
    pOVar1 = (threads->m_data).
             super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pOVar2 = (threads->m_data).
             super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = ((long)pOVar1 - (long)pOVar2 >> 3) * -0x71c71c71c71c71c7;
    if (pOVar1 != pOVar2) {
      String::String(&local_50.first,profile);
      local_50.second.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_50.second.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_50.second.m_data.super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (threads->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::OclThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::OclThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::OclThreads>>>
      ::_M_insert_unique<std::pair<xmrig::String_const,xmrig::OclThreads>>
                ((_Rb_tree<xmrig::String,std::pair<xmrig::String_const,xmrig::OclThreads>,std::_Select1st<std::pair<xmrig::String_const,xmrig::OclThreads>>,std::less<xmrig::String>,std::allocator<std::pair<xmrig::String_const,xmrig::OclThreads>>>
                  *)this,&local_50);
      std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::~vector
                (&local_50.second.m_data);
      if (local_50.first.m_data != (char *)0x0) {
        operator_delete__(local_50.first.m_data);
      }
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }